

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

CompatibleInterfacesBase * __thiscall
cmGeneratorTarget::GetCompatibleInterfaces(cmGeneratorTarget *this,string *config)

{
  cmGeneratorTarget *this_00;
  mapped_type *this_01;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar1;
  char *pcVar2;
  pointer ppcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  allocator<char> local_99;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_90;
  undefined8 local_88;
  mapped_type *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_50;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_48;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_40;
  pointer local_38;
  
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompatibleInterfaces,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompatibleInterfaces>_>_>
            ::operator[](&this->CompatibleInterfacesMap,config);
  local_78 = this_01;
  if (this_01->Done == false) {
    this_01->Done = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"POSITION_INDEPENDENT_CODE",(allocator<char> *)&local_98);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_01,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"AUTOUIC_OPTIONS",(allocator<char> *)&local_98);
    local_40 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(this_01->super_CompatibleInterfacesBase).PropsString;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>(local_40,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pvVar1 = GetLinkImplementationClosure(this,config);
    local_38 = (pvVar1->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    local_48 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(this_01->super_CompatibleInterfacesBase).PropsNumberMin;
    local_50 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(this_01->super_CompatibleInterfacesBase).PropsNumberMax;
    for (ppcVar3 = (pvVar1->
                   super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppcVar3 != local_38;
        ppcVar3 = ppcVar3 + 1) {
      this_00 = *ppcVar3;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"COMPATIBLE_INTERFACE_BOOL",(allocator<char> *)&local_98);
      pcVar2 = GetProperty(this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (pcVar2 != (char *)0x0) {
        local_98._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        _Stack_90._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_88 = 0;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar2,&local_99);
        cmSystemTools::ExpandListArgument
                  (&local_70,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_98,false);
        std::__cxx11::string::~string((string *)&local_70);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_78,local_98,_Stack_90);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_98);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"COMPATIBLE_INTERFACE_STRING",(allocator<char> *)&local_98);
      pcVar2 = GetProperty(this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (pcVar2 != (char *)0x0) {
        local_98._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        _Stack_90._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_88 = 0;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar2,&local_99);
        cmSystemTools::ExpandListArgument
                  (&local_70,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_98,false);
        std::__cxx11::string::~string((string *)&local_70);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (local_40,local_98,_Stack_90);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_98);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"COMPATIBLE_INTERFACE_NUMBER_MIN",(allocator<char> *)&local_98)
      ;
      pcVar2 = GetProperty(this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (pcVar2 != (char *)0x0) {
        local_98._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        _Stack_90._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_88 = 0;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar2,&local_99);
        cmSystemTools::ExpandListArgument
                  (&local_70,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_98,false);
        std::__cxx11::string::~string((string *)&local_70);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (local_48,local_98,_Stack_90);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_98);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"COMPATIBLE_INTERFACE_NUMBER_MAX",(allocator<char> *)&local_98)
      ;
      pcVar2 = GetProperty(this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (pcVar2 != (char *)0x0) {
        local_98._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        _Stack_90._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_88 = 0;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar2,&local_99);
        cmSystemTools::ExpandListArgument
                  (&local_70,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_98,false);
        std::__cxx11::string::~string((string *)&local_70);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (local_50,local_98,_Stack_90);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_98);
      }
    }
  }
  return &local_78->super_CompatibleInterfacesBase;
}

Assistant:

const cmGeneratorTarget::CompatibleInterfacesBase&
cmGeneratorTarget::GetCompatibleInterfaces(std::string const& config) const
{
  cmGeneratorTarget::CompatibleInterfaces& compat =
    this->CompatibleInterfacesMap[config];
  if (!compat.Done) {
    compat.Done = true;
    compat.PropsBool.insert("POSITION_INDEPENDENT_CODE");
    compat.PropsString.insert("AUTOUIC_OPTIONS");
    std::vector<cmGeneratorTarget const*> const& deps =
      this->GetLinkImplementationClosure(config);
    for (cmGeneratorTarget const* li : deps) {
#define CM_READ_COMPATIBLE_INTERFACE(X, x)                                    \
  if (const char* prop = li->GetProperty("COMPATIBLE_INTERFACE_" #X)) {       \
    std::vector<std::string> props;                                           \
    cmSystemTools::ExpandListArgument(prop, props);                           \
    compat.Props##x.insert(props.begin(), props.end());                       \
  }
      CM_READ_COMPATIBLE_INTERFACE(BOOL, Bool)
      CM_READ_COMPATIBLE_INTERFACE(STRING, String)
      CM_READ_COMPATIBLE_INTERFACE(NUMBER_MIN, NumberMin)
      CM_READ_COMPATIBLE_INTERFACE(NUMBER_MAX, NumberMax)
#undef CM_READ_COMPATIBLE_INTERFACE
    }
  }
  return compat;
}